

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::Lex::MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
          (Lex *this,DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree,String *regExpr,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
          *macroSyntaxTrees)

{
  uint pos;
  bool bVar1;
  RegExprDFANode *pRVar2;
  RegExprDFAParseElement *pRVar3;
  Lex *this_00;
  undefined1 local_308 [8];
  Parse<SGParser::Generator::RegExprDFAParseElement> parse;
  InputStream local_1a8;
  MemBufferInputStream inputStream;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  RegExprDFANode *pnodeAccept;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ParseHandler<SGParser::Generator::RegExprDFAParseElement> local_c8;
  undefined8 local_c0;
  Lex *pLStack_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  *local_b0;
  void *pvStack_a8;
  iterator local_a0;
  RegExprDFANode **ppRStack_98;
  String local_90;
  String local_70;
  String local_50;
  
  this_00 = this;
  if (MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
      ::parseTable == '\0') {
    MakeSyntaxTree<SGParser::Generator::RegExprDFANode>();
  }
  if (MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable.Type == None)
  {
    parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream =
         (_func_int **)&parse;
    parse.pParseTable._0_4_ = 0;
    parse.pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
    parse.Stream.pFirstBlock = (StreamBlock *)0x0;
    parse.Stream.LengthLeft = (size_t)&parse.Stream.ThisPos;
    parse.Stream.ThisPos._0_4_ = 0;
    parse.Stream.RememberLength = 0;
    parse.StackPosition =
         (long)&parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header + 0x18;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parse.Stream.SourceEOFFlag = false;
    parse.Stream._65_7_ = 0;
    parse.Stream.Markers._M_t._M_impl._0_8_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parse.pValidTokenStackPositions = (size_t *)&parse.Token;
    parse.Token.super_TokenCode.Code = 0;
    parse.ReduceLeft = 0;
    parse._188_4_ = 0;
    parse.pStack = (RegExprDFAParseElement *)0x0;
    parse.TopState = 0;
    parse.NextTokenFlag = false;
    parse._165_3_ = 0;
    parse.ErrorStackStr.field_2._8_4_ = 0;
    parse.ErrorStackStr._M_string_length = 0;
    parse.ErrorStackStr.field_2._M_allocated_capacity = 0;
    parse.LastErrorState = 0;
    parse._212_4_ = 0;
    parse.ErrorStackStr._M_dataplus._M_p = (pointer)0x0;
    parse.Stream.pSourceStream =
         (TokenStream<SGParser::Generator::RegExprParseToken> *)
         parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream;
    parse.Stream.Pos = parse.Stream.LengthLeft;
    parse.StackSize = parse.StackPosition;
    parse.ErrorMarker = (size_t)parse.pValidTokenStackPositions;
    CreateRegExpGrammar(this_00,(Grammar *)local_308);
    bVar1 = ParseTableGen::Create
                      (&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable,
                       (Grammar *)local_308,CLR);
    Grammar::~Grammar((Grammar *)local_308);
    if (!bVar1) {
      return false;
    }
  }
  inputStream.super_InputStream._vptr_InputStream = (_func_int **)(regExpr->_M_dataplus)._M_p;
  inputStream.buf = (uint8_t *)regExpr->_M_string_length;
  local_1a8._vptr_InputStream = (_func_int **)&PTR__MemBufferInputStream_001622d8;
  inputStream.size = 0;
  TokenizerImpl<SGParser::Generator::RegExprParseToken>::TokenizerImpl
            ((TokenizerImpl<SGParser::Generator::RegExprParseToken> *)&inputStream.pos,&local_1a8);
  inputStream.pos = (size_t)&PTR__TokenizerImpl_00164c80;
  Parse<SGParser::Generator::RegExprDFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_308,
             &MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)&inputStream.pos,0x800);
  local_c8._vptr_ParseHandler = (_func_int **)&PTR__RegExprDFAParseHandler_00164d70;
  local_c0 = 0;
  pvStack_a8 = (void *)0x0;
  local_a0._M_current = (RegExprDFANode **)0x0;
  ppRStack_98 = (RegExprDFANode **)0x0;
  pLStack_b8 = this;
  local_b0 = macroSyntaxTrees;
  bVar1 = Parse<SGParser::Generator::RegExprDFAParseElement>::DoParse
                    ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_308,&local_c8);
  if (bVar1) {
    pRVar2 = (RegExprDFANode *)operator_new(0x80);
    pos = local_c0._4_4_;
    local_c0 = CONCAT44(local_c0._4_4_ + 1,(undefined4)local_c0);
    RegExprDFANode::RegExprDFANode(pRVar2,Char,pos,1);
    pRVar2->AcceptingState = 1;
    tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>._56_8_ = pRVar2;
    pRVar2 = (RegExprDFANode *)operator_new(0x80);
    pRVar2->Type = And;
    pRVar2->ID = 0;
    pRVar2->Position = 0;
    (pRVar2->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar2->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar2->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar2->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar2->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar2->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar2->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar2->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar2->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar2->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar2->pParent = (RegExprDFANode *)0x0;
    (pRVar2->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar2->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar2->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar3 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_308,0);
    RegExprDFANode::Add(pRVar2,(pRVar3->field_1).pNode);
    RegExprDFANode::Add(pRVar2,(RegExprDFANode *)
                               tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>
                               ._56_8_);
    RegExprDFANode::Setup(pRVar2);
    if (local_a0._M_current == ppRStack_98) {
      std::
      vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
      ::_M_realloc_insert<SGParser::Generator::RegExprDFANode*const&>
                ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                  *)&pvStack_a8,local_a0,
                 (RegExprDFANode **)
                 &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
    }
    else {
      *local_a0._M_current =
           (RegExprDFANode *)
           tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>._56_8_;
      local_a0._M_current = local_a0._M_current + 1;
    }
    tree->pRoot = pRVar2;
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::operator=(&tree->CharNodes,
                (vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                 *)&pvStack_a8);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"DFA Syntax Tree: Regular expression parsing error","");
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ParseMessage::ParseMessage
              ((ParseMessage *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38,
               ErrorMessage,&local_50,&local_70,0,0xffffffffffffffff,0xffffffffffffffff,&local_90,0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ParseMessageBuffer::AddMessage
              (&this->Messages,
               (ParseMessage *)
               &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.field_0x38);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8._M_allocated_capacity + 1);
    }
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pnodeAccept != &local_130) {
      operator_delete(pnodeAccept,local_130._M_allocated_capacity + 1);
    }
  }
  if (pvStack_a8 != (void *)0x0) {
    operator_delete(pvStack_a8,(long)ppRStack_98 - (long)pvStack_a8);
  }
  Parse<SGParser::Generator::RegExprDFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_308);
  TokenizerBase::FreeAllBuffers((TokenizerBase *)&tokenizer);
  return bVar1;
}

Assistant:

bool Lex::MakeSyntaxTree(DFASyntaxTree<T>& tree, const String& regExpr,
                         std::map<String, DFASyntaxTree<T>*>& macroSyntaxTrees) {
    // Cache the parse table
    static ParseTableGen parseTable;

    if (!parseTable.IsValid()) {
        Grammar grammar;
        // Create the hard coded Regular Expression grammar
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!parseTable.Create(grammar))
            return false; // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExpr};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprDFAParseElement> parse{&parseTable, &tokenizer};
    RegExprDFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID          = 0u;
    parseHandler.PositionCount     = 0u;
    parseHandler.pLex              = this;
    parseHandler.pMacroSyntaxTrees = &macroSyntaxTrees;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "DFA Syntax Tree: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Append the final accepting node
    // Make the fake accept character node
    const auto pnodeAccept      = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                     parseHandler.PositionCount++, 1u};
    pnodeAccept->AcceptingState = 1u;
    // Make the root node
    const auto pnodeRoot        = new RegExprDFANode{RegExprDFANode::NodeType::And};
    pnodeRoot->pParent          = nullptr;
    pnodeRoot->Add(parse[0].pNode);
    pnodeRoot->Add(pnodeAccept);
    pnodeRoot->Setup();

    // Add the accept node to the nodes list
    parseHandler.Nodes.push_back(pnodeAccept);

    // Set the destination tree data
    tree.pRoot     = pnodeRoot;
    tree.CharNodes = parseHandler.Nodes;

    return true;
}